

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void Ifn_NtkMatchPrintConfig(Ifn_Ntk_t *p,sat_solver *pSat)

{
  long lVar1;
  uint uVar2;
  int local_20;
  uint local_1c;
  int i;
  int v;
  sat_solver *pSat_local;
  Ifn_Ntk_t *p_local;
  
  for (local_1c = p->nObjs; (int)local_1c < p->nPars; local_1c = local_1c + 1) {
    local_20 = p->nInps;
    while ((local_20 < p->nObjs &&
           ((((undefined1  [48])p->Nodes[local_20] & (undefined1  [48])0x7) != (undefined1  [48])0x6
            || ((*(uint *)(p->Nodes + local_20) >> 8 & 0xff) != local_1c))))) {
      local_20 = local_20 + 1;
    }
    if (local_20 < p->nObjs) {
      printf(" ");
    }
    else if ((p->nParsVIni <= (int)local_1c) && ((int)(local_1c - p->nParsVIni) % p->nParsVNum == 0)
            ) {
      lVar1 = (long)(int)(local_1c - p->nParsVIni);
      printf(" %d=",lVar1 / (long)p->nParsVNum & 0xffffffff,lVar1 % (long)p->nParsVNum & 0xffffffff)
      ;
    }
    uVar2 = sat_solver_var_value(pSat,local_1c);
    printf("%d",(ulong)uVar2);
  }
  return;
}

Assistant:

void Ifn_NtkMatchPrintConfig( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int v, i;
    for ( v = p->nObjs; v < p->nPars; v++ )
    {
        for ( i = p->nInps; i < p->nObjs; i++ )
            if ( p->Nodes[i].Type == IFN_DSD_PRIME && (int)p->Nodes[i].iFirst == v )
                break;
        if ( i < p->nObjs )
            printf( " " );
        else if ( v >= p->nParsVIni && (v - p->nParsVIni) % p->nParsVNum == 0 )
            printf( " %d=", (v - p->nParsVIni) / p->nParsVNum );
        printf( "%d", sat_solver_var_value(pSat, v) );
    }
}